

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::CollapseButton(ImGuiID id,ImVec2 *pos)

{
  float fVar1;
  float fVar2;
  ImGuiWindow *window;
  ImVec2 p_min;
  ImGuiContext *pIVar3;
  bool bVar4;
  bool bVar5;
  ImU32 col;
  ImGuiCol idx;
  bool hovered;
  bool held;
  ImRect bb;
  bool local_42;
  bool local_41;
  ImRect local_40;
  ImVec2 local_30;
  
  pIVar3 = GImGui;
  window = GImGui->CurrentWindow;
  fVar1 = (GImGui->Style).FramePadding.x;
  fVar2 = (GImGui->Style).FramePadding.y;
  local_40.Max.x = fVar1 + fVar1 + pos->x + GImGui->FontSize;
  local_40.Max.y = fVar2 + fVar2 + GImGui->FontSize + pos->y;
  local_40.Min = *pos;
  ItemAdd(&local_40,id,(ImRect *)0x0);
  bVar4 = ButtonBehavior(&local_40,id,&local_42,&local_41,0);
  if ((local_41 != true) || (idx = 0x17, local_42 == false)) {
    idx = local_42 + 0x15;
  }
  col = GetColorU32(idx,1.0);
  if ((local_42 != false) || (local_41 == true)) {
    local_30.y = (local_40.Min.y + local_40.Max.y) * 0.5 + -0.5;
    local_30.x = (local_40.Min.x + local_40.Max.x) * 0.5 + 0.0;
    ImDrawList::AddCircleFilled(window->DrawList,&local_30,pIVar3->FontSize * 0.5 + 1.0,col,9);
  }
  p_min.y = local_40.Min.y + (pIVar3->Style).FramePadding.y;
  p_min.x = local_40.Min.x + (pIVar3->Style).FramePadding.x;
  RenderArrow(p_min,(window->Collapsed ^ 1) * 2 + 1,1.0);
  bVar5 = IsItemActive();
  if (bVar5) {
    bVar5 = IsMouseDragging(0,-1.0);
    if (bVar5) {
      StartMouseMovingWindow(window);
    }
  }
  return bVar4;
}

Assistant:

bool ImGui::CollapseButton(ImGuiID id, const ImVec2& pos)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    ImRect bb(pos, pos + ImVec2(g.FontSize, g.FontSize) + g.Style.FramePadding * 2.0f);
    ItemAdd(bb, id);
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_None);

    ImU32 col = GetColorU32((held && hovered) ? ImGuiCol_ButtonActive : hovered ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
    if (hovered || held)
        window->DrawList->AddCircleFilled(bb.GetCenter() + ImVec2(0.0f, -0.5f), g.FontSize * 0.5f + 1.0f, col, 9);
    RenderArrow(bb.Min + g.Style.FramePadding, window->Collapsed ? ImGuiDir_Right : ImGuiDir_Down, 1.0f);

    // Switch to moving the window after mouse is moved beyond the initial drag threshold
    if (IsItemActive() && IsMouseDragging())
        StartMouseMovingWindow(window);

    return pressed;
}